

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TranslatorFederate.cpp
# Opt level: O1

string * __thiscall
helics::TranslatorFederate::query_abi_cxx11_
          (string *__return_storage_ptr__,TranslatorFederate *this,string_view queryStr)

{
  value_t vVar1;
  json_value jVar2;
  pointer pcVar3;
  pointer puVar4;
  void *pvVar5;
  pointer pGVar6;
  TimeCoordinator *this_00;
  int iVar7;
  reference pvVar8;
  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
  *pbVar9;
  string *psVar10;
  string *psVar11;
  long lVar12;
  size_t __n;
  char *pcVar13;
  GlobalFederateId *dep;
  object_t *poVar14;
  char *pcVar15;
  data *this_01;
  pointer puVar16;
  size_type __rlen;
  json base;
  json tran;
  vector<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_> local_328;
  string *local_310;
  data local_308;
  data local_2f8;
  data local_2e8;
  data local_2d8;
  data local_2c8;
  data local_2b8;
  data local_2a8;
  data local_290;
  TimeCoordinator *local_280;
  data local_278;
  data local_268;
  data local_258;
  data local_248;
  data local_238;
  data local_228;
  data local_218;
  data local_208;
  data local_1f8;
  data local_1e8;
  data local_1d8;
  data local_1c8;
  data local_1b8;
  data local_1a8;
  data local_198;
  data local_188;
  data local_178;
  data local_168;
  data local_150;
  data local_140;
  data local_130;
  data local_120;
  data local_110;
  data local_100;
  data local_f0;
  data local_e0;
  data local_d0;
  data local_c0;
  data local_b0;
  data local_a0;
  data local_90;
  data local_80;
  data local_70;
  data local_60;
  data local_50;
  data local_40;
  
  pcVar13 = queryStr._M_str;
  __n = queryStr._M_len;
  this_01 = (data *)&local_328;
  lVar12 = __n - 5;
  local_310 = __return_storage_ptr__;
  switch(lVar12) {
  case 0:
switchD_00329167_caseD_0:
    iVar7 = bcmp(pcVar13,"state",__n);
    if (iVar7 == 0) {
      psVar11 = fedStateString_abi_cxx11_(this->current_state);
      psVar10 = local_310;
      (local_310->_M_dataplus)._M_p = (pointer)&local_310->field_2;
      pcVar3 = (psVar11->_M_dataplus)._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)local_310,pcVar3,pcVar3 + psVar11->_M_string_length);
      return psVar10;
    }
    switch(__n) {
    case 6:
switchD_00329273_caseD_6:
      iVar7 = bcmp(pcVar13,"inputs",__n);
      if (iVar7 == 0) goto LAB_003294d5;
      switch(__n) {
      case 6:
        goto switchD_0032949b_caseD_6;
      default:
        break;
      case 9:
        goto switchD_00329167_caseD_4;
      case 10:
        goto switchD_00329167_caseD_5;
      case 0xb:
        goto switchD_00329167_caseD_6;
      case 0xc:
        goto switchD_003292e3_caseD_c;
      case 0xd:
        goto switchD_00329167_caseD_8;
      case 0xf:
        goto switchD_00329167_caseD_a;
      case 0x10:
        goto switchD_00329167_caseD_b;
      case 0x12:
        goto switchD_00329167_caseD_d;
      case 0x15:
        goto switchD_00329167_caseD_10;
      }
    case 9:
      goto switchD_00329167_caseD_4;
    case 10:
      goto switchD_00329167_caseD_5;
    case 0xb:
      goto switchD_00329167_caseD_6;
    case 0xc:
      goto switchD_00329167_caseD_7;
    case 0xd:
      goto switchD_00329167_caseD_8;
    case 0xf:
      goto switchD_00329167_caseD_a;
    case 0x10:
      goto switchD_00329167_caseD_b;
    case 0x12:
      goto switchD_00329167_caseD_d;
    case 0x15:
      goto switchD_00329167_caseD_10;
    }
    break;
  case 1:
    iVar7 = bcmp(pcVar13,"exists",__n);
    if (iVar7 == 0) {
LAB_00329700:
      (local_310->_M_dataplus)._M_p = (pointer)&local_310->field_2;
      pcVar15 = "true";
      pcVar13 = "";
      goto LAB_00329818;
    }
    switch(lVar12) {
    case 0:
      goto switchD_00329167_caseD_0;
    case 1:
      goto switchD_00329207_caseD_1;
    case 2:
      goto switchD_00329167_caseD_2;
    case 4:
      goto switchD_00329167_caseD_4;
    case 5:
      goto switchD_00329167_caseD_5;
    case 6:
      goto switchD_00329167_caseD_6;
    case 7:
      goto switchD_00329167_caseD_7;
    case 8:
      goto switchD_00329167_caseD_8;
    case 10:
      goto switchD_00329167_caseD_a;
    case 0xb:
      goto switchD_00329167_caseD_b;
    case 0xd:
      goto switchD_00329167_caseD_d;
    case 0x10:
      goto switchD_00329167_caseD_10;
    }
    break;
  case 2:
switchD_00329167_caseD_2:
    iVar7 = bcmp(pcVar13,"version",__n);
    if (iVar7 == 0) {
      (local_310->_M_dataplus)._M_p = (pointer)&local_310->field_2;
      pcVar15 = "3.6.1 (2025-02-24)";
      pcVar13 = "";
      goto LAB_00329818;
    }
    switch(lVar12) {
    case 0:
      goto switchD_00329167_caseD_0;
    case 1:
switchD_00329207_caseD_1:
      iVar7 = bcmp(pcVar13,"isinit",__n);
      if (iVar7 == 0) goto LAB_00329700;
      switch(lVar12) {
      case 0:
        goto switchD_00329167_caseD_0;
      case 1:
        goto switchD_00329273_caseD_6;
      default:
        break;
      case 4:
        goto switchD_00329167_caseD_4;
      case 5:
        goto switchD_00329167_caseD_5;
      case 6:
        goto switchD_00329167_caseD_6;
      case 7:
        goto switchD_00329167_caseD_7;
      case 8:
        goto switchD_00329167_caseD_8;
      case 10:
        goto switchD_00329167_caseD_a;
      case 0xb:
        goto switchD_00329167_caseD_b;
      case 0xd:
        goto switchD_00329167_caseD_d;
      case 0x10:
        goto switchD_00329167_caseD_10;
      }
    case 4:
      goto switchD_00329167_caseD_4;
    case 5:
      goto switchD_00329167_caseD_5;
    case 6:
      goto switchD_00329167_caseD_6;
    case 7:
      goto switchD_00329167_caseD_7;
    case 8:
      goto switchD_00329167_caseD_8;
    case 10:
      goto switchD_00329167_caseD_a;
    case 0xb:
      goto switchD_00329167_caseD_b;
    case 0xd:
      goto switchD_00329167_caseD_d;
    case 0x10:
      goto switchD_00329167_caseD_10;
    }
    break;
  case 4:
switchD_00329167_caseD_4:
    iVar7 = bcmp(pcVar13,"endpoints",__n);
    if (iVar7 == 0) goto LAB_003294d5;
    switch(__n) {
    case 6:
      goto switchD_0032949b_caseD_6;
    case 10:
      goto switchD_00329167_caseD_5;
    case 0xb:
      goto switchD_00329167_caseD_6;
    case 0xc:
      goto switchD_003292e3_caseD_c;
    case 0xd:
      goto switchD_00329167_caseD_8;
    case 0xf:
      goto switchD_00329167_caseD_a;
    case 0x10:
      goto switchD_00329167_caseD_b;
    case 0x15:
      goto switchD_00329167_caseD_10;
    }
    break;
  case 5:
switchD_00329167_caseD_5:
    iVar7 = bcmp(pcVar13,"interfaces",__n);
    if (iVar7 != 0) {
      switch(__n) {
      case 6:
        goto switchD_0032949b_caseD_6;
      case 10:
        goto switchD_0032949b_caseD_a;
      case 0xb:
        goto switchD_00329167_caseD_6;
      case 0xc:
        goto switchD_003292e3_caseD_c;
      case 0xd:
        goto switchD_00329353_caseD_d;
      case 0xf:
        goto switchD_00329167_caseD_a;
      case 0x10:
        goto switchD_00329167_caseD_b;
      case 0x15:
        goto switchD_00329167_caseD_10;
      }
      break;
    }
    goto LAB_003294d5;
  case 6:
switchD_00329167_caseD_6:
    iVar7 = bcmp(pcVar13,"global_time",__n);
    if (iVar7 == 0) {
      local_328.
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ =
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x0;
      local_328.
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_100,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"attributes");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_100.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_100.m_value;
      local_100.m_type = vVar1;
      local_100.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_100);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_110,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_110.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_110.m_value;
      local_110.m_type = vVar1;
      local_110.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_110);
      local_228.m_type = null;
      local_228._1_7_ = 0;
      local_228.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_228,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,anon_var_dwarf_70a93 + 0x27);
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_228.m_type;
      local_228.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_228.m_value;
      local_228.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_228);
      local_238.m_type = null;
      local_238._1_7_ = 0;
      local_238.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_238,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_238.m_type;
      local_238.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_238.m_value;
      local_238.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_238);
      lVar12 = (this->mCoord).time_granted.internalTimeCode;
      local_248.m_type = null;
      local_248._1_7_ = 0;
      local_248.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_248,(double)(lVar12 % 1000000000) * 1e-09 + (double)(lVar12 / 1000000000)
                );
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"granted_time");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_248.m_type;
      local_248.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_248.m_value;
      local_248.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_248);
      lVar12 = (this->mCoord).info.outputDelay.internalTimeCode +
               (this->mCoord).time_granted.internalTimeCode;
      local_258.m_type = null;
      local_258._1_7_ = 0;
      local_258.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_258,(double)(lVar12 % 1000000000) * 1e-09 + (double)(lVar12 / 1000000000)
                );
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"send_time");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_258.m_type;
      local_258.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_258.m_value;
      local_258.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_258);
      fileops::generateJsonString(local_310,(json *)&local_328,true);
      this_01 = (data *)&local_328;
      goto LAB_0032a60e;
    }
    if (__n == 0x10) goto switchD_00329167_caseD_b;
    break;
  case 7:
switchD_00329167_caseD_7:
    iVar7 = bcmp(pcVar13,"publications",__n);
    if (iVar7 != 0) {
      switch(__n) {
      case 6:
        goto switchD_00329273_caseD_6;
      default:
        goto switchD_00329167_caseD_3;
      case 9:
        goto switchD_00329167_caseD_4;
      case 10:
        goto switchD_00329167_caseD_5;
      case 0xb:
        goto switchD_00329167_caseD_6;
      case 0xc:
        goto switchD_003292e3_caseD_c;
      case 0xd:
        goto switchD_00329167_caseD_8;
      case 0xf:
        goto switchD_00329167_caseD_a;
      case 0x10:
        goto switchD_00329167_caseD_b;
      case 0x12:
        goto switchD_00329167_caseD_d;
      case 0x15:
        goto switchD_00329167_caseD_10;
      }
    }
    goto LAB_003294d5;
  case 8:
switchD_00329167_caseD_8:
    iVar7 = bcmp(pcVar13,"subscriptions",__n);
    if (iVar7 != 0) {
      switch(__n) {
      case 6:
        goto switchD_0032949b_caseD_6;
      default:
        goto switchD_00329167_caseD_3;
      case 10:
        goto switchD_00329167_caseD_5;
      case 0xb:
        goto switchD_00329167_caseD_6;
      case 0xc:
        goto switchD_003292e3_caseD_c;
      case 0xd:
        goto switchD_00329353_caseD_d;
      case 0xf:
        goto switchD_00329167_caseD_a;
      case 0x10:
        goto switchD_00329167_caseD_b;
      case 0x15:
        goto switchD_00329167_caseD_10;
      }
    }
LAB_003294d5:
    (local_310->_M_dataplus)._M_p = (pointer)&local_310->field_2;
    pcVar15 = "[]";
    pcVar13 = "";
    goto LAB_00329818;
  case 10:
switchD_00329167_caseD_a:
    iVar7 = bcmp(pcVar13,"data_flow_graph",__n);
    if (iVar7 == 0) {
      local_328.
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ =
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x0;
      local_328.
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_d0,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"attributes");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_d0.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_d0.m_value;
      local_d0.m_type = vVar1;
      local_d0.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_d0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_e0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_e0.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_e0.m_value;
      local_e0.m_type = vVar1;
      local_e0.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_e0);
      local_208.m_type = null;
      local_208._1_7_ = 0;
      local_208.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_208,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,anon_var_dwarf_70a93 + 0x27);
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_208.m_type;
      local_208.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_208.m_value;
      local_208.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_208);
      local_218.m_type = null;
      local_218._1_7_ = 0;
      local_218.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_218,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_218.m_type;
      local_218.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_218.m_value;
      local_218.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_218);
      if ((this->translators).dataStorage.
          super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->translators).dataStorage.
          super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_f0,(initializer_list_t)ZEXT816(0),false,array);
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_328,"translators");
        vVar1 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_f0.m_type;
        jVar2 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value = local_f0.m_value;
        local_f0.m_type = vVar1;
        local_f0.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_f0);
        puVar16 = (this->translators).dataStorage.
                  super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        puVar4 = (this->translators).dataStorage.
                 super__Vector_base<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>,_std::allocator<std::unique_ptr<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        if (puVar16 != puVar4) {
          do {
            local_308.m_type = null;
            local_308.m_value.object = (object_t *)0x0;
            local_2f8.m_type = null;
            local_2f8._1_7_ = 0;
            local_2f8.m_value.object = (object_t *)0x0;
            nlohmann::json_abi_v3_11_3::detail::
            external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
            construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2f8,
                       (long)(((puVar16->_M_t).
                               super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                               .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl)
                             ->id).handle.hid);
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&local_308,anon_var_dwarf_70a93 + 0x27);
            vVar1 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_2f8.m_type;
            local_2f8.m_type = vVar1;
            jVar2 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value.object = (object_t *)local_2f8.m_value;
            local_2f8.m_value = jVar2;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_2f8);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_290,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &((puVar16->_M_t).
                         super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                         .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>._M_head_impl)->key)
            ;
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&local_308,"name");
            vVar1 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_290.m_type;
            jVar2 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value = local_290.m_value;
            local_290.m_type = vVar1;
            local_290.m_value = jVar2;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_290);
            psVar10 = EndpointInfo::getSourceTargets_abi_cxx11_
                                (&((puVar16->_M_t).
                                   super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                                   .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>.
                                  _M_head_impl)->ept);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2b8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10)
            ;
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&local_308,"source_endpoints");
            vVar1 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_2b8.m_type;
            jVar2 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value = local_2b8.m_value;
            local_2b8.m_type = vVar1;
            local_2b8.m_value = jVar2;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_2b8);
            psVar10 = EndpointInfo::getDestinationTargets_abi_cxx11_
                                (&((puVar16->_M_t).
                                   super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                                   .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>.
                                  _M_head_impl)->ept);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2c8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10)
            ;
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&local_308,"destination_endpoints");
            vVar1 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_2c8.m_type;
            jVar2 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value = local_2c8.m_value;
            local_2c8.m_type = vVar1;
            local_2c8.m_value = jVar2;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_2c8);
            psVar10 = PublicationInfo::getTargets_abi_cxx11_
                                (&((puVar16->_M_t).
                                   super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                                   .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>.
                                  _M_head_impl)->pub);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2d8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10)
            ;
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&local_308,"source_publications");
            vVar1 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_2d8.m_type;
            jVar2 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value = local_2d8.m_value;
            local_2d8.m_type = vVar1;
            local_2d8.m_value = jVar2;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_2d8);
            psVar10 = InputInfo::getTargets_abi_cxx11_
                                (&((puVar16->_M_t).
                                   super___uniq_ptr_impl<helics::TranslatorInfo,_std::default_delete<helics::TranslatorInfo>_>
                                   ._M_t.
                                   super__Tuple_impl<0UL,_helics::TranslatorInfo_*,_std::default_delete<helics::TranslatorInfo>_>
                                   .super__Head_base<0UL,_helics::TranslatorInfo_*,_false>.
                                  _M_head_impl)->ipt);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::
            basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                      ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                        *)&local_2e8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10)
            ;
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&local_308,"destination_inputs");
            vVar1 = (pvVar8->m_data).m_type;
            (pvVar8->m_data).m_type = local_2e8.m_type;
            jVar2 = (pvVar8->m_data).m_value;
            (pvVar8->m_data).m_value = local_2e8.m_value;
            local_2e8.m_type = vVar1;
            local_2e8.m_value = jVar2;
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_2e8);
            pvVar8 = nlohmann::json_abi_v3_11_3::
                     basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                     ::operator[]<char_const>
                               ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                 *)&local_328,"translators");
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::push_back(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                                *)&local_308);
            nlohmann::json_abi_v3_11_3::
            basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
            ::data::~data(&local_308);
            puVar16 = puVar16 + 1;
          } while (puVar16 != puVar4);
        }
      }
      fileops::generateJsonString(local_310,(json *)&local_328,true);
      this_01 = (data *)&local_328;
      goto LAB_0032a60e;
    }
    if (__n == 0x10) goto switchD_00329167_caseD_b;
    if (__n == 0xb) goto switchD_00329167_caseD_6;
    break;
  case 0xb:
switchD_00329167_caseD_b:
    iVar7 = bcmp(pcVar13,"dependency_graph",__n);
    if (iVar7 == 0) {
      local_308.m_type = null;
      local_308.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_120,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_308,"attributes");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_120.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_120.m_value;
      local_120.m_type = vVar1;
      local_120.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_120);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_130,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_308,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_130.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_130.m_value;
      local_130.m_type = vVar1;
      local_130.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_130);
      local_268.m_type = null;
      local_268._1_7_ = 0;
      local_268.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_268,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_308,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,anon_var_dwarf_70a93 + 0x27);
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_268.m_type;
      local_268.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_268.m_value;
      local_268.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_268);
      local_278.m_type = null;
      local_278._1_7_ = 0;
      local_278.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_278,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_308,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_278.m_type;
      local_278.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_278.m_value;
      local_278.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_278);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_140,(initializer_list_t)ZEXT816(0),false,array);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_308,"dependents");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_140.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_140.m_value;
      local_140.m_type = vVar1;
      local_140.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_140);
      local_280 = &this->mCoord;
      TimeCoordinator::getDependents(&local_328,local_280);
      pGVar6 = local_328.
               super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar14 = (object_t *)
                CONCAT71(local_328.
                         super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_328.
                         super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (poVar14 !=
          (object_t *)
          local_328.
          super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&local_308,"dependents");
          local_2a8.m_type = null;
          local_2a8._1_7_ = 0;
          local_2a8.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_2a8,(long)*(int *)&(poVar14->_M_t)._M_impl);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_2a8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_2a8);
          poVar14 = (object_t *)&(poVar14->_M_t)._M_impl.field_0x4;
        } while (poVar14 != (object_t *)pGVar6);
      }
      pvVar5 = (void *)CONCAT71(local_328.
                                super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_328.
                                super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_328.
                                     super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar5);
      }
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_150,(initializer_list_t)ZEXT816(0),false,array);
      this_00 = local_280;
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_308,"dependencies");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_150.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_150.m_value;
      local_150.m_type = vVar1;
      local_150.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_150);
      TimeCoordinator::getDependencies(&local_328,this_00);
      pGVar6 = local_328.
               super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      poVar14 = (object_t *)
                CONCAT71(local_328.
                         super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                         ._M_impl.super__Vector_impl_data._M_start._1_7_,
                         local_328.
                         super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                         ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (poVar14 !=
          (object_t *)
          local_328.
          super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        do {
          pvVar8 = nlohmann::json_abi_v3_11_3::
                   basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                   ::operator[]<char_const>
                             ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                               *)&local_308,"dependencies");
          local_2a8.m_type = null;
          local_2a8._1_7_ = 0;
          local_2a8.m_value.object = (object_t *)0x0;
          nlohmann::json_abi_v3_11_3::detail::
          external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
          construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                    ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_2a8,(long)*(int *)&(poVar14->_M_t)._M_impl);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::push_back(pvVar8,(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                              *)&local_2a8);
          nlohmann::json_abi_v3_11_3::
          basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
          ::data::~data(&local_2a8);
          poVar14 = (object_t *)&(poVar14->_M_t)._M_impl.field_0x4;
        } while (poVar14 != (object_t *)pGVar6);
      }
      pvVar5 = (void *)CONCAT71(local_328.
                                super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                local_328.
                                super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                ._M_impl.super__Vector_impl_data._M_start._0_1_);
      if (pvVar5 != (void *)0x0) {
        operator_delete(pvVar5,(long)local_328.
                                     super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)pvVar5);
      }
      fileops::generateJsonString(local_310,(json *)&local_308,true);
      this_01 = &local_308;
LAB_0032a60e:
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(this_01);
      return local_310;
    }
    break;
  case 0xd:
switchD_00329167_caseD_d:
    iVar7 = bcmp(pcVar13,"filtered_endpoints",__n);
    if (iVar7 == 0) goto LAB_003294d5;
    switch(__n) {
    case 6:
      goto switchD_0032949b_caseD_6;
    case 9:
      goto switchD_00329167_caseD_4;
    case 10:
      goto switchD_00329167_caseD_5;
    case 0xb:
      goto switchD_00329167_caseD_6;
    case 0xc:
      goto switchD_003292e3_caseD_c;
    case 0xd:
      goto switchD_00329167_caseD_8;
    case 0xf:
      goto switchD_00329167_caseD_a;
    case 0x10:
      goto switchD_00329167_caseD_b;
    case 0x15:
      goto switchD_00329167_caseD_10;
    }
    break;
  case 0x10:
switchD_00329167_caseD_10:
    iVar7 = bcmp(pcVar13,"global_time_debugging",__n);
    if (iVar7 == 0) {
      local_328.
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ =
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x0;
      local_328.
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_a0,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"attributes");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_a0.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_a0.m_value;
      local_a0.m_type = vVar1;
      local_a0.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_a0);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_b0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_b0.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_b0.m_value;
      local_b0.m_type = vVar1;
      local_b0.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_b0);
      local_1e8.m_type = null;
      local_1e8._1_7_ = 0;
      local_1e8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1e8,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,anon_var_dwarf_70a93 + 0x27);
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_1e8.m_type;
      local_1e8.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_1e8.m_value;
      local_1e8.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1e8);
      local_1f8.m_type = null;
      local_1f8._1_7_ = 0;
      local_1f8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1f8,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_1f8.m_type;
      local_1f8.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_1f8.m_value;
      local_1f8.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1f8);
      psVar10 = fedStateString_abi_cxx11_(this->current_state);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_c0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"state");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_c0.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_c0.m_value;
      local_c0.m_type = vVar1;
      local_c0.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_c0);
      TimeCoordinator::generateDebuggingTimeInfo(&this->mCoord,(json *)&local_328);
      fileops::generateJsonString(local_310,(json *)&local_328,true);
      this_01 = (data *)&local_328;
      goto LAB_0032a60e;
    }
    switch(__n) {
    case 6:
switchD_0032949b_caseD_6:
      iVar7 = bcmp(pcVar13,"config",__n);
      if (iVar7 == 0) {
        local_328.
        super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ =
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x0;
        local_328.
        super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        TimeCoordinator::generateConfig(&this->mCoord,(json *)&local_328);
        fileops::generateJsonString(local_310,(json *)&local_328,true);
        this_01 = (data *)&local_328;
        goto LAB_0032a60e;
      }
      switch(__n) {
      case 10:
switchD_00329774_caseD_a:
        iVar7 = bcmp(pcVar13,"dependents",__n);
        if (iVar7 == 0) {
          TimeCoordinator::getDependents(&local_328,&this->mCoord);
          generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::TranslatorFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__1>
                    (local_310,&local_328);
LAB_0032a649:
          pvVar5 = (void *)CONCAT71(local_328.
                                    super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                    ._M_impl.super__Vector_impl_data._M_start._1_7_,
                                    local_328.
                                    super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                    ._M_impl.super__Vector_impl_data._M_start._0_1_);
          if (pvVar5 == (void *)0x0) {
            return local_310;
          }
          operator_delete(pvVar5,(long)local_328.
                                       super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage -
                                 (long)pvVar5);
          return local_310;
        }
        if (__n == 0xb) goto switchD_00329167_caseD_6;
        if (__n == 0x10) goto switchD_00329167_caseD_b;
        if (__n == 0xf) goto switchD_00329167_caseD_a;
        break;
      case 0xb:
        goto switchD_00329167_caseD_6;
      case 0xf:
        goto switchD_00329167_caseD_a;
      case 0x10:
        goto switchD_00329167_caseD_b;
      }
      break;
    case 10:
switchD_0032949b_caseD_a:
      iVar7 = bcmp(pcVar13,"timeconfig",__n);
      if (iVar7 == 0) {
        local_328.
        super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ =
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x0;
        local_328.
        super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        TimeCoordinator::generateConfig(&this->mCoord,(json *)&local_328);
        fileops::generateJsonString(local_310,(json *)&local_328,true);
        this_01 = (data *)&local_328;
        goto LAB_0032a60e;
      }
      switch(__n) {
      case 6:
        goto switchD_0032949b_caseD_6;
      case 10:
        goto switchD_00329774_caseD_a;
      case 0xb:
        goto switchD_00329167_caseD_6;
      case 0xf:
        goto switchD_00329167_caseD_a;
      case 0x10:
        goto switchD_00329167_caseD_b;
      }
      break;
    case 0xb:
      goto switchD_00329167_caseD_6;
    case 0xf:
      goto switchD_00329167_caseD_a;
    case 0x10:
      goto switchD_00329167_caseD_b;
    }
  }
switchD_00329167_caseD_3:
  (local_310->_M_dataplus)._M_p = (pointer)&local_310->field_2;
  pcVar15 = "#invalid";
  pcVar13 = "";
LAB_00329818:
  psVar10 = local_310;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_310,pcVar15,pcVar13);
  return psVar10;
switchD_003292e3_caseD_c:
  iVar7 = bcmp(pcVar13,"dependencies",__n);
  if (iVar7 == 0) {
    TimeCoordinator::getDependencies(&local_328,&this->mCoord);
    generateStringVector<std::vector<helics::GlobalFederateId,std::allocator<helics::GlobalFederateId>>,helics::TranslatorFederate::query[abi:cxx11](std::basic_string_view<char,std::char_traits<char>>)const::__0>
              (local_310,&local_328);
    goto LAB_0032a649;
  }
  switch(__n - 6) {
  case 0:
    goto switchD_0032949b_caseD_6;
  case 4:
    goto switchD_0032949b_caseD_a;
  case 5:
    goto switchD_00329167_caseD_6;
  case 6:
    iVar7 = bcmp(pcVar13,"current_time",__n);
    psVar10 = local_310;
    if (iVar7 == 0) {
      TimeCoordinator::printTimeStatus_abi_cxx11_(local_310,&this->mCoord);
      return psVar10;
    }
    switch(__n - 6) {
    case 0:
      goto switchD_0032949b_caseD_6;
    case 4:
      goto switchD_0032949b_caseD_a;
    case 5:
      goto switchD_00329167_caseD_6;
    case 6:
switchD_0032942f_caseD_c:
      iVar7 = bcmp(pcVar13,"global_state",__n);
      if (iVar7 == 0) {
        local_328.
        super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
        _M_impl.super__Vector_impl_data._M_start._0_1_ =
             (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
              )0x0;
        local_328.
        super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
        _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                      *)&local_70,(initializer_list_t)ZEXT816(0),false,object);
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_328,"attributes");
        vVar1 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_70.m_type;
        jVar2 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value = local_70.m_value;
        local_70.m_type = vVar1;
        local_70.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_70);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_80,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName
                  );
        pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_328,"attributes");
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar9,"name");
        vVar1 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_80.m_type;
        jVar2 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value = local_80.m_value;
        local_80.m_type = vVar1;
        local_80.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_80);
        local_1c8.m_type = null;
        local_1c8._1_7_ = 0;
        local_1c8.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1c8,(long)(this->mFedID).gid);
        pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_328,"attributes");
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar9,anon_var_dwarf_70a93 + 0x27);
        vVar1 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_1c8.m_type;
        local_1c8.m_type = vVar1;
        jVar2 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value.object = (object_t *)local_1c8.m_value;
        local_1c8.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1c8);
        local_1d8.m_type = null;
        local_1d8._1_7_ = 0;
        local_1d8.m_value.object = (object_t *)0x0;
        nlohmann::json_abi_v3_11_3::detail::
        external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
        construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_1d8,(long)(this->mCoreID).gid);
        pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  *)nlohmann::json_abi_v3_11_3::
                    basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                    ::operator[]<char_const>
                              ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                                *)&local_328,"attributes");
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>(pbVar9,"parent");
        vVar1 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_1d8.m_type;
        local_1d8.m_type = vVar1;
        jVar2 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value.object = (object_t *)local_1d8.m_value;
        local_1d8.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_1d8);
        psVar10 = fedStateString_abi_cxx11_(this->current_state);
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::
        basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                  ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_90,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10);
        pvVar8 = nlohmann::json_abi_v3_11_3::
                 basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                 ::operator[]<char_const>
                           ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                             *)&local_328,"state");
        vVar1 = (pvVar8->m_data).m_type;
        (pvVar8->m_data).m_type = local_90.m_type;
        jVar2 = (pvVar8->m_data).m_value;
        (pvVar8->m_data).m_value = local_90.m_value;
        local_90.m_type = vVar1;
        local_90.m_value = jVar2;
        nlohmann::json_abi_v3_11_3::
        basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
        ::data::~data(&local_90);
        fileops::generateJsonString(local_310,(json *)&local_328,true);
        goto LAB_0032a60e;
      }
      switch(__n) {
      case 10:
        goto switchD_0032949b_caseD_a;
      case 0xb:
        goto switchD_00329167_caseD_6;
      case 0xc:
      case 0xd:
      case 0xe:
      case 0x11:
      case 0x12:
      case 0x13:
      case 0x14:
        break;
      case 0xf:
        goto switchD_00329167_caseD_a;
      case 0x10:
        goto switchD_00329167_caseD_b;
      case 0x15:
        goto switchD_00329167_caseD_10;
      default:
        if (__n == 6) goto switchD_0032949b_caseD_6;
      }
      break;
    case 7:
      goto switchD_00329353_caseD_d;
    case 9:
      goto switchD_00329167_caseD_a;
    case 10:
      goto switchD_00329167_caseD_b;
    case 0xf:
      goto switchD_00329167_caseD_10;
    }
    break;
  case 7:
switchD_00329353_caseD_d:
    iVar7 = bcmp(pcVar13,"current_state",__n);
    if (iVar7 == 0) {
      local_328.
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_start._0_1_ =
           (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
            )0x0;
      local_328.
      super__Vector_base<helics::GlobalFederateId,_std::allocator<helics::GlobalFederateId>_>.
      _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                    *)&local_40,(initializer_list_t)ZEXT816(0),false,object);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"attributes");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_40.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_40.m_value;
      local_40.m_type = vVar1;
      local_40.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_40);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_50,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&this->mName);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"name");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_50.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_50.m_value;
      local_50.m_type = vVar1;
      local_50.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_50);
      local_168.m_type = null;
      local_168._1_7_ = 0;
      local_168.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_168,(long)(this->mFedID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,anon_var_dwarf_70a93 + 0x27);
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_168.m_type;
      local_168.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_168.m_value;
      local_168.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_168);
      local_178.m_type = null;
      local_178._1_7_ = 0;
      local_178.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_178,(long)(this->mCoreID).gid);
      pbVar9 = (basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                *)nlohmann::json_abi_v3_11_3::
                  basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                  ::operator[]<char_const>
                            ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                              *)&local_328,"attributes");
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>(pbVar9,"parent");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_178.m_type;
      local_178.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_178.m_value;
      local_178.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_178);
      psVar10 = fedStateString_abi_cxx11_(this->current_state);
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::
      basic_json<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_0>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_60,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"state");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_60.m_type;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value = local_60.m_value;
      local_60.m_type = vVar1;
      local_60.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_60);
      local_188.m_type = null;
      local_188._1_7_ = 0;
      local_188.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_188,0);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"publications");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_188.m_type;
      local_188.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_188.m_value;
      local_188.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_188);
      local_198.m_type = null;
      local_198._1_7_ = 0;
      local_198.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_198,0);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"input");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_198.m_type;
      local_198.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_198.m_value;
      local_198.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_198);
      local_1a8.m_type = null;
      local_1a8._1_7_ = 0;
      local_1a8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1a8,0);
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"endpoints");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_1a8.m_type;
      local_1a8.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_1a8.m_value;
      local_1a8.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1a8);
      lVar12 = (this->mCoord).time_granted.internalTimeCode;
      local_1b8.m_type = null;
      local_1b8._1_7_ = 0;
      local_1b8.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_3::detail::
      external_constructor<(nlohmann::json_abi_v3_11_3::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_3::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>>
                ((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
                  *)&local_1b8,(double)(lVar12 % 1000000000) * 1e-09 + (double)(lVar12 / 1000000000)
                );
      pvVar8 = nlohmann::json_abi_v3_11_3::
               basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
               ::operator[]<char_const>
                         ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_3::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>,void>
                           *)&local_328,"granted_time");
      vVar1 = (pvVar8->m_data).m_type;
      (pvVar8->m_data).m_type = local_1b8.m_type;
      local_1b8.m_type = vVar1;
      jVar2 = (pvVar8->m_data).m_value;
      (pvVar8->m_data).m_value.object = (object_t *)local_1b8.m_value;
      local_1b8.m_value = jVar2;
      nlohmann::json_abi_v3_11_3::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_3::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_void>
      ::data::~data(&local_1b8);
      fileops::generateJsonString(local_310,(json *)&local_328,true);
      this_01 = (data *)&local_328;
      goto LAB_0032a60e;
    }
    switch(__n) {
    case 6:
      goto switchD_0032949b_caseD_6;
    case 10:
      goto switchD_0032949b_caseD_a;
    case 0xb:
      goto switchD_00329167_caseD_6;
    case 0xc:
      goto switchD_0032942f_caseD_c;
    case 0xf:
      goto switchD_00329167_caseD_a;
    case 0x10:
      goto switchD_00329167_caseD_b;
    case 0x15:
      goto switchD_00329167_caseD_10;
    }
    break;
  case 9:
    goto switchD_00329167_caseD_a;
  case 10:
    goto switchD_00329167_caseD_b;
  case 0xf:
    goto switchD_00329167_caseD_10;
  }
  goto switchD_00329167_caseD_3;
}

Assistant:

std::string TranslatorFederate::query(std::string_view queryStr) const
{
    if (queryStr == "exists") {
        return "true";
    }
    if (queryStr == "version") {
        return versionString;
    }
    if (queryStr == "isinit") {
        return "true";
    }
    if (queryStr == "state") {
        return fedStateString(current_state);
    }

    if (queryStr == "publications" || queryStr == "inputs" || queryStr == "filtered_endpoints" ||
        queryStr == "endpoints" || queryStr == "subscriptions") {
        return "[]";
    }

    if (queryStr == "interfaces") {
        return "[]";
    }

    if (queryStr == "dependencies") {
        return generateStringVector(mCoord.getDependencies(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (queryStr == "current_time") {
        return mCoord.printTimeStatus();
    }
    if (queryStr == "current_state") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["state"] = fedStateString(current_state);
        base["publications"] = 0;
        base["input"] = 0;
        base["endpoints"] = 0;
        base["granted_time"] = static_cast<double>(mCoord.getGrantedTime());
        return fileops::generateJsonString(base);
    }
    if (queryStr == "global_state") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["state"] = fedStateString(current_state);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "global_time_debugging") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["state"] = fedStateString(current_state);
        mCoord.generateDebuggingTimeInfo(base);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "timeconfig") {
        nlohmann::json base;
        mCoord.generateConfig(base);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "config") {
        nlohmann::json base;
        mCoord.generateConfig(base);
        return fileops::generateJsonString(base);
    }
    if (queryStr == "dependents") {
        return generateStringVector(mCoord.getDependents(),
                                    [](auto& dep) { return std::to_string(dep.baseValue()); });
    }
    if (queryStr == "data_flow_graph") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        if (translators.size() > 0) {
            base["translators"] = nlohmann::json::array();
            for (const auto& trans : translators) {
                nlohmann::json tran;
                tran["id"] = trans->id.handle.baseValue();
                tran["name"] = trans->key;

                tran["source_endpoints"] = trans->getEndpointInfo()->getSourceTargets();
                tran["destination_endpoints"] = trans->getEndpointInfo()->getDestinationTargets();
                tran["source_publications"] = trans->getPubInfo()->getTargets();
                tran["destination_inputs"] = trans->getInputInfo()->getTargets();
                base["translators"].push_back(std::move(tran));
            }
        }
        return fileops::generateJsonString(base);
    }
    if (queryStr == "global_time") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["granted_time"] = static_cast<double>(mCoord.getGrantedTime());
        base["send_time"] = static_cast<double>(mCoord.allowedSendTime());
        return fileops::generateJsonString(base);
    }
    if (queryStr == "dependency_graph") {
        nlohmann::json base;
        base["attributes"] = nlohmann::json::object();
        base["attributes"]["name"] = mName;
        base["attributes"]["id"] = mFedID.baseValue();
        base["attributes"]["parent"] = mCoreID.baseValue();
        base["dependents"] = nlohmann::json::array();
        for (auto& dep : mCoord.getDependents()) {
            base["dependents"].push_back(dep.baseValue());
        }
        base["dependencies"] = nlohmann::json::array();
        for (auto& dep : mCoord.getDependencies()) {
            base["dependencies"].push_back(dep.baseValue());
        }
        return fileops::generateJsonString(base);
    }

    return "#invalid";
}